

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rkd_tree_hh_data.hpp
# Opt level: O2

point<float,_784UL> * __thiscall
pico_tree::internal::random_normal<float,784ul>
          (point<float,_784UL> *__return_storage_ptr__,internal *this,size_t dim)

{
  uint uVar1;
  size_t i;
  internal *piVar2;
  result_type rVar3;
  random_device rd;
  mt19937 e;
  normal_distribution<float> local_2748;
  random_device local_2738;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b0;
  
  std::random_device::random_device(&local_2738);
  uVar1 = ::std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13b0,(ulong)uVar1);
  local_2748._M_param._M_mean = 0.0;
  local_2748._M_param._M_stddev = 1.0;
  local_2748._M_saved = 0.0;
  local_2748._M_saved_available = false;
  memset(__return_storage_ptr__,0,0xc40);
  for (piVar2 = (internal *)0x0; this != piVar2; piVar2 = piVar2 + 1) {
    rVar3 = ::std::normal_distribution<float>::operator()(&local_2748,&local_13b0);
    (__return_storage_ptr__->elems_)._M_elems[(long)piVar2] = rVar3;
  }
  point<float,_784UL>::normalize(__return_storage_ptr__);
  std::random_device::~random_device(&local_2738);
  return __return_storage_ptr__;
}

Assistant:

inline point<Scalar_, Dim_> random_normal(size_t dim) {
  std::random_device rd;
  std::mt19937 e(rd());
  std::normal_distribution<Scalar_> gaussian(Scalar_(0), Scalar_(1));

  point<Scalar_, Dim_> v = point<Scalar_, Dim_>::from_size(dim);

  for (size_t i = 0; i < dim; ++i) {
    v[i] = gaussian(e);
  }

  v.normalize();

  return v;
}